

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFboTestCase.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::FboTestCase::checkFramebufferStatus(FboTestCase *this,deUint32 target)

{
  deUint32 reason;
  FboIncompleteException *this_00;
  
  reason = sglr::ContextWrapper::glCheckFramebufferStatus(&this->super_ContextWrapper,target);
  if (reason == 0x8cd5) {
    return;
  }
  this_00 = (FboIncompleteException *)__cxa_allocate_exception(0x38);
  FboTestUtil::FboIncompleteException::FboIncompleteException
            (this_00,reason,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fFboTestCase.cpp"
             ,0x91);
  __cxa_throw(this_00,&FboTestUtil::FboIncompleteException::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void FboTestCase::checkFramebufferStatus (deUint32 target)
{
	deUint32 status = glCheckFramebufferStatus(target);
	if (status != GL_FRAMEBUFFER_COMPLETE)
		throw FboTestUtil::FboIncompleteException(status, __FILE__, __LINE__);
}